

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O0

void CB_ALGS::output_example(vw *all,cb *data,example *ec,label *ld)

{
  byte bVar1;
  shared_data *this;
  int *piVar2;
  byte bVar3;
  ulong uVar4;
  int **ppiVar5;
  size_t sVar6;
  cb_class *pcVar7;
  ostream *poVar8;
  v_array<CB::cb_class> *in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  cb_class cl;
  uint i;
  stringstream outputStringStream;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  cb_to_cs *c;
  float loss;
  undefined8 in_stack_fffffffffffffd48;
  label *in_stack_fffffffffffffd50;
  code *pcVar9;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 uVar10;
  string local_240 [36];
  undefined8 local_21c;
  undefined8 local_214;
  uint local_1fc;
  stringstream local_1f8 [16];
  ostream local_1e8;
  undefined1 in_stack_ffffffffffffff87;
  multi_ex *in_stack_ffffffffffffff88;
  example *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 is_test;
  vw *in_stack_ffffffffffffffa0;
  int *local_40;
  float local_24;
  
  local_24 = 0.0;
  uVar4 = (*(code *)PTR_test_label_00486de0)(in_RCX);
  if ((uVar4 & 1) == 0) {
    local_24 = get_unbiased_cost((cb_class *)
                                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                 in_stack_fffffffffffffd50,
                                 (uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  }
  this = (shared_data *)*in_RDI;
  bVar1 = *(byte *)(in_RDX + 0x68c8);
  bVar3 = (*(code *)PTR_test_label_00486de0)(in_RCX);
  shared_data::update(this,(bool)(bVar1 & 1),(bool)((bVar3 ^ 0xff) & 1),local_24,1.0,
                      *(size_t *)(in_RDX + 0x68a0));
  ppiVar5 = v_array<int>::begin((v_array<int> *)(in_RDI + 0x6a2));
  local_40 = *ppiVar5;
  ppiVar5 = v_array<int>::end((v_array<int> *)(in_RDI + 0x6a2));
  piVar2 = *ppiVar5;
  for (; is_test = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38), local_40 != piVar2;
      local_40 = local_40 + 1) {
    in_stack_ffffffffffffff90 = *(example **)(in_RDX + 0x6878);
    in_stack_ffffffffffffff98 = *(undefined8 *)(in_RDX + 0x6880);
    in_stack_ffffffffffffffa0 = *(vw **)(in_RDX + 0x6888);
    (*(code *)in_RDI[0x6a7])((float)*(uint *)(in_RDX + 0x6850),0,*local_40);
  }
  if (0 < *(int *)(in_RDI + 0x6a6)) {
    std::__cxx11::stringstream::stringstream(local_1f8);
    local_1fc = 0;
    while( true ) {
      uVar4 = (ulong)local_1fc;
      sVar6 = v_array<CB::cb_class>::size(in_RCX);
      is_test = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
      if (sVar6 <= uVar4) break;
      pcVar7 = v_array<CB::cb_class>::operator[](in_RCX,(ulong)local_1fc);
      local_21c._0_4_ = pcVar7->cost;
      local_21c._4_4_ = pcVar7->action;
      local_214._0_4_ = pcVar7->probability;
      local_214._4_4_ = pcVar7->partial_prediction;
      if (local_1fc != 0) {
        std::operator<<(&local_1e8,' ');
      }
      poVar8 = (ostream *)std::ostream::operator<<(&local_1e8,local_21c._4_4_);
      poVar8 = std::operator<<(poVar8,':');
      std::ostream::operator<<(poVar8,local_214._4_4_);
      local_1fc = local_1fc + 1;
    }
    pcVar9 = (code *)in_RDI[0x6a8];
    uVar10 = *(undefined4 *)(in_RDI + 0x6a6);
    std::__cxx11::stringstream::str();
    (*pcVar9)(uVar10,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  (*(code *)PTR_test_label_00486de0)(in_RCX);
  CB::print_update(in_stack_ffffffffffffffa0,(bool)is_test,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
  return;
}

Assistant:

void output_example(vw& all, cb& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;
  if (!CB::cb_label.test_label(&ld))
    loss = get_unbiased_cost(c.known_cost, c.pred_scores, ec.pred.multiclass);

  all.sd->update(ec.test_only, !CB::cb_label.test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      cb_class cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.action << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, CB::cb_label.test_label(&ld), ec, nullptr, false);
}